

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_local.hpp
# Opt level: O2

void __thiscall
openjij::test::PolySystemKLP_ConstructorGraphDenseInt_Test::TestBody
          (PolySystemKLP_ConstructorGraphDenseInt_Test *this)

{
  allocator<char> local_61;
  string local_60;
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_40;
  
  GeneratePolynomialInteractionsDenseInt<double>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Dense",&local_61);
  TestKLPConstructorGraph<unsigned_long,double>
            ((Polynomial<unsigned_long,_double> *)&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_40);
  return;
}

Assistant:

TEST(PolySystemKLP, ConstructorGraphDenseInt) {
   TestKLPConstructorGraph<openjij::graph::Index, double>(GeneratePolynomialInteractionsDenseInt<double>(), "Dense");
}